

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sys_Event.h
# Opt level: O0

__pid_t __thiscall
axl::sys::CondMutexEventBase<axl::sl::False>::wait
          (CondMutexEventBase<axl::sl::False> *this,void *__stat_loc)

{
  bool bVar1;
  uint uVar2;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  undefined8 extraout_RAX_01;
  undefined8 uVar3;
  bool result;
  False local_17;
  byte local_16;
  False local_15;
  uint local_14;
  CondMutexEventBase<axl::sl::False> *local_10;
  undefined1 local_1;
  
  local_14 = (uint)__stat_loc;
  local_10 = this;
  psx::CondMutexPair::lock((CondMutexPair *)0x1a828c);
  if ((this->m_state & 1U) == 0) {
    uVar2 = psx::CondMutexPair::wait(&this->m_condMutexPair,(void *)(ulong)local_14);
    local_16 = (byte)uVar2 & 1;
    if ((uVar2 & 1) == 0) {
      psx::CondMutexPair::unlock((CondMutexPair *)0x1a82e9);
      local_1 = 0;
      uVar3 = extraout_RAX_00;
    }
    else {
      bVar1 = sl::False::operator()(&local_17);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        this->m_state = false;
      }
      psx::CondMutexPair::unlock((CondMutexPair *)0x1a8315);
      local_1 = 1;
      uVar3 = extraout_RAX_01;
    }
  }
  else {
    bVar1 = sl::False::operator()(&local_15);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      this->m_state = false;
    }
    psx::CondMutexPair::unlock((CondMutexPair *)0x1a82bd);
    local_1 = 1;
    uVar3 = extraout_RAX;
  }
  return (__pid_t)CONCAT71((int7)((ulong)uVar3 >> 8),local_1);
}

Assistant:

bool
	wait(uint_t timeout = -1) {
		m_condMutexPair.lock();

		if (m_state) {
			if (!IsNotificationEvent()())
				m_state = false;

			m_condMutexPair.unlock();
			return true;
		}

		bool result = m_condMutexPair.wait(timeout);
		if (!result) {
			m_condMutexPair.unlock();
			return false;
		}

		if (!IsNotificationEvent()())
			m_state = false;

		m_condMutexPair.unlock();
		return true;
	}